

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

void pybind11::
     class_<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<NodeView_*,_std::vector<NodeView,_std::allocator<NodeView>_>_>,___gnu_cxx::__normal_iterator<NodeView_*,_std::vector<NodeView,_std::allocator<NodeView>_>_>,_false,_(pybind11::return_value_policy)6>_>
     ::dealloc(value_and_holder *v_h)

{
  byte *pbVar1;
  void **ppvVar2;
  instance *piVar3;
  byte bVar4;
  error_scope scope;
  error_scope eStack_28;
  
  PyErr_Fetch(&eStack_28,&eStack_28.value,&eStack_28.trace);
  bVar4 = v_h->inst->field_0x30;
  if ((bVar4 & 2) == 0) {
    bVar4 = (v_h->inst->field_1).nonsimple.status[v_h->index];
  }
  else {
    bVar4 = bVar4 >> 2;
  }
  ppvVar2 = v_h->vh;
  if ((bVar4 & 1) == 0) {
    operator_delete(*ppvVar2,v_h->type->type_size);
  }
  else {
    if (ppvVar2[1] != (void *)0x0) {
      operator_delete(ppvVar2[1],0x18);
    }
    ppvVar2[1] = (void *)0x0;
    piVar3 = v_h->inst;
    if ((piVar3->field_0x30 & 2) == 0) {
      pbVar1 = (piVar3->field_1).nonsimple.status + v_h->index;
      *pbVar1 = *pbVar1 & 0xfe;
    }
    else {
      piVar3->field_0x30 = piVar3->field_0x30 & 0xfb;
    }
  }
  *v_h->vh = (void *)0x0;
  error_scope::~error_scope(&eStack_28);
  return;
}

Assistant:

static void dealloc(detail::value_and_holder &v_h) {
        // We could be deallocating because we are cleaning up after a Python exception.
        // If so, the Python error indicator will be set. We need to clear that before
        // running the destructor, in case the destructor code calls more Python.
        // If we don't, the Python API will exit with an exception, and pybind11 will
        // throw error_already_set from the C++ destructor which is forbidden and triggers
        // std::terminate().
        error_scope scope;
        if (v_h.holder_constructed()) {
            v_h.holder<holder_type>().~holder_type();
            v_h.set_holder_constructed(false);
        }
        else {
            detail::call_operator_delete(v_h.value_ptr<type>(),
                v_h.type->type_size,
                v_h.type->type_align
            );
        }
        v_h.value_ptr() = nullptr;
    }